

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.cpp
# Opt level: O2

void __thiscall sjtu::TrainManager::refund_ticket(TrainManager *this,orderType *order)

{
  stationType *psVar1;
  int *piVar2;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  orderType *poVar3;
  __type _Var4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  int i;
  long lVar7;
  pair<long,_bool> pVar8;
  allocator local_fa;
  allocator local_f9;
  TrainManager *local_f8;
  orderType *local_f0;
  trainType *local_e8;
  ulong local_e0;
  long local_d8;
  char (*local_d0) [41];
  char (*local_c8) [41];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long local_40;
  undefined1 local_38;
  trainType *this_01;
  
  this_00 = this->TrainBpTree;
  local_f8 = this;
  local_f0 = order;
  std::__cxx11::string::string((string *)&local_80,order->trainID,(allocator *)&local_60);
  local_c0._M_dataplus._M_p =
       (pointer)StringHasher::operator()((StringHasher *)&local_f8->field_0x10,&local_80);
  pVar8 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,(unsigned_long_long *)&local_c0);
  local_40 = pVar8.first;
  local_38 = pVar8.second;
  std::__cxx11::string::~string((string *)&local_80);
  iVar5 = (*(local_f8->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2]
          )(local_f8->TrainFile,&local_40);
  poVar3 = local_f0;
  this_01 = (trainType *)CONCAT44(extraout_var,iVar5);
  iVar5 = timeType::dateminus(local_f0->date,this_01->saleDate);
  local_d0 = poVar3->station;
  std::__cxx11::string::string((string *)&local_a0,*local_d0,(allocator *)&local_c0);
  iVar6 = trainType::get_Delta_date(this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_d8 = (long)(iVar6 + iVar5);
  local_c8 = local_f0->station + 1;
  local_e0 = 0;
  local_e8 = this_01;
  for (lVar7 = 0; lVar7 < this_01->stationNum; lVar7 = lVar7 + 1) {
    if ((local_e0 & 1) != 0) {
      piVar2 = local_e8->stations[0].seatNum + local_d8;
      *piVar2 = *piVar2 + local_f0->num;
    }
    psVar1 = local_e8->stations;
    std::__cxx11::string::string((string *)&local_c0,psVar1->stationName,&local_f9);
    std::__cxx11::string::string((string *)&local_60,*local_c8,&local_fa);
    _Var4 = std::operator==(&local_c0,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_c0);
    if (_Var4) break;
    std::__cxx11::string::string((string *)&local_c0,psVar1->stationName,&local_f9);
    std::__cxx11::string::string((string *)&local_60,*local_d0,&local_fa);
    _Var4 = std::operator==(&local_c0,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_c0);
    local_e0 = CONCAT71((int7)(local_e0 >> 8),(byte)local_e0 | _Var4);
    local_e8 = (trainType *)(local_e8->stations[0].seatNum + 0x57);
  }
  (*(local_f8->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
            (local_f8->TrainFile,&this_01->offset);
  return;
}

Assistant:

void TrainManager::refund_ticket(orderType *order)
	{
		auto ret = TrainBpTree -> find(hasher(order -> trainID));
		trainType *train = TrainFile -> read(ret.first);
		int day_id = timeType::dateminus(order -> date[0] , train -> saleDate[0]) + train -> get_Delta_date(std::string(order -> station[0]));
		bool flag = false;
		for (int i = 0;i < train -> stationNum;++ i)
		{
			if (flag) train -> stations[i].seatNum[day_id] += order -> num;
			if (std::string(train -> stations[i].stationName) == std::string(order -> station[1])) break;
			if (std::string(train -> stations[i].stationName) == std::string(order -> station[0])) flag = true;
		}
		TrainFile -> save(train -> offset);
	}